

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIBoolValueImpl::~FIBoolValueImpl(FIBoolValueImpl *this)

{
  FIBoolValueImpl *this_local;
  
  (this->super_FIBoolValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__00faa2c0;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIBoolValue::~FIBoolValue(&this->super_FIBoolValue);
  return;
}

Assistant:

inline FIBoolValueImpl(std::vector<bool> &&value_): strValueValid(false) { value = std::move(value_); }